

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O3

int SSL_CTX_set0_verify_cert_store(SSL_CTX *ctx,X509_STORE *store)

{
  CERT *pCVar1;
  
  if ((ctx != (SSL_CTX *)0x0) &&
     (ctx->x509_method != (SSL_X509_METHOD *)bssl::ssl_crypto_x509_method)) {
    __assert_fail("ctx == NULL || ctx->x509_method == &ssl_crypto_x509_method",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                  ,0x2c,"void bssl::check_ssl_ctx_x509_method(const SSL_CTX *)");
  }
  pCVar1 = (ctx->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl;
  X509_STORE_free((X509_STORE *)pCVar1->verify_store);
  pCVar1->verify_store = store;
  return 1;
}

Assistant:

int SSL_CTX_set0_verify_cert_store(SSL_CTX *ctx, X509_STORE *store) {
  check_ssl_ctx_x509_method(ctx);
  return set_cert_store(&ctx->cert->verify_store, store, 0);
}